

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O2

void __thiscall glslang::TSymbolTable::adoptLevels(TSymbolTable *this,TSymbolTable *symTable)

{
  pointer ppTVar1;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    ppTVar1 = (symTable->table).
              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(symTable->table).
                      super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <=
        (ulong)uVar2) break;
    std::vector<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>::
    push_back(&this->table,ppTVar1 + uVar2);
    this->adoptedLevels = this->adoptedLevels + 1;
    uVar2 = uVar2 + 1;
  }
  this->uniqueId = symTable->uniqueId;
  this->noBuiltInRedeclarations = symTable->noBuiltInRedeclarations;
  this->separateNameSpaces = symTable->separateNameSpaces;
  return;
}

Assistant:

void adoptLevels(TSymbolTable& symTable)
    {
        for (unsigned int level = 0; level < symTable.table.size(); ++level) {
            table.push_back(symTable.table[level]);
            ++adoptedLevels;
        }
        uniqueId = symTable.uniqueId;
        noBuiltInRedeclarations = symTable.noBuiltInRedeclarations;
        separateNameSpaces = symTable.separateNameSpaces;
    }